

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void process_shader(GLuint *shader,char *source,GLint shader_type)

{
  GLuint GVar1;
  GLenum GVar2;
  undefined8 uVar3;
  GLint status;
  char *shaders [1];
  GLsizei length;
  char buffer [1024];
  GLint local_42c;
  GLchar *local_428;
  int local_41c;
  GLchar local_418 [1032];
  
  local_42c = 0;
  local_428 = (char *)0x0;
  GVar1 = (*ctx.glCreateShader)(shader_type);
  *shader = GVar1;
  GVar2 = (*ctx.glGetError)();
  if (GVar2 == 0) {
    local_428 = source;
    (*ctx.glShaderSource)(*shader,1,&local_428,(GLint *)0x0);
    GVar2 = (*ctx.glGetError)();
    if (GVar2 == 0) {
      local_428 = (char *)0x0;
      (*ctx.glCompileShader)(*shader);
      GVar2 = (*ctx.glGetError)();
      if (GVar2 == 0) {
        (*ctx.glGetShaderiv)(*shader,0x8b81,&local_42c);
        GVar2 = (*ctx.glGetError)();
        if (GVar2 == 0) {
          if (local_42c == 1) {
            return;
          }
          goto LAB_00104a72;
        }
        uVar3 = 0xd1;
      }
      else {
        uVar3 = 0xd0;
      }
    }
    else {
      uVar3 = 0xca;
    }
  }
  else {
    uVar3 = 0xc6;
  }
  SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar2,GVar2,uVar3);
  quit(1);
LAB_00104a72:
  (*ctx.glGetProgramInfoLog)(*shader,0x400,&local_41c,local_418);
  local_418[local_41c] = '\0';
  SDL_Log("Shader compilation failed: %s",local_418);
  fflush(_stderr);
  quit(-1);
  return;
}

Assistant:

void 
process_shader(GLuint *shader, const char * source, GLint shader_type)
{
    GLint status = GL_FALSE;
    const char *shaders[1] = { NULL };
    char buffer[1024];
    GLsizei length;

    /* Create shader and load into GL. */
    *shader = GL_CHECK(ctx.glCreateShader(shader_type));

    shaders[0] = source;

    GL_CHECK(ctx.glShaderSource(*shader, 1, shaders, NULL));

    /* Clean up shader source. */
    shaders[0] = NULL;

    /* Try compiling the shader. */
    GL_CHECK(ctx.glCompileShader(*shader));
    GL_CHECK(ctx.glGetShaderiv(*shader, GL_COMPILE_STATUS, &status));

    /* Dump debug info (source and log) if compilation failed. */
    if(status != GL_TRUE) {
        ctx.glGetProgramInfoLog(*shader, sizeof(buffer), &length, &buffer[0]);
        buffer[length] = '\0';
        SDL_Log("Shader compilation failed: %s", buffer);fflush(stderr);
        quit(-1);
    }
}